

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::shapeConstructorTest<true>(ViewTest *this)

{
  undefined1 *puVar1;
  int iVar2;
  value_type vVar3;
  value_type vVar4;
  reference pvVar5;
  size_t sVar6;
  size_type sVar7;
  ulong uVar8;
  reference piVar9;
  size_t sVar10;
  bool local_301;
  bool local_271;
  bool local_221;
  bool local_1e9;
  ulong local_1e8;
  size_t p;
  size_t k_1;
  size_t j_7;
  ulong local_1c8;
  size_t j_6;
  unsigned_short j_5;
  iterator iStack_1b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b0;
  undefined1 local_1a8 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_160 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  ulong local_140;
  size_t k;
  size_t j_4;
  ulong local_128;
  size_t j_3;
  unsigned_short j_2;
  iterator iStack_118;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_110;
  undefined1 local_108 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  ulong local_a0;
  size_t j_1;
  unsigned_short j;
  iterator iStack_90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  undefined1 local_80 [8];
  View<int,_true,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar5 = 0x18;
  local_88._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iStack_90 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_1 + 7));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_80,local_88,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_90._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_1 + 7));
  sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_221 = false;
  if (sVar6 == sVar7) {
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
    local_221 = sVar6 == 0x18;
  }
  j_1._6_1_ = local_221;
  test((bool *)((long)&j_1 + 6));
  j_1._4_2_ = 0;
  while( true ) {
    uVar8 = (ulong)j_1._4_2_;
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
    if (sVar7 <= uVar8) break;
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80,(ulong)j_1._4_2_)
    ;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,
                        (ulong)j_1._4_2_);
    j_1._3_1_ = sVar6 == *pvVar5;
    test((bool *)((long)&j_1 + 3));
    j_1._4_2_ = j_1._4_2_ + 1;
  }
  local_a0 = 0;
  while( true ) {
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
    if (sVar6 <= local_a0) break;
    piVar9 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80,local_a0);
    shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar9 == this->data_[local_a0];
    test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_a0 = local_a0 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar1 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,2,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,0);
  *pvVar5 = 6;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,1);
  *pvVar5 = 4;
  local_110._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
  iStack_118 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_3 + 7));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_108,local_110,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_118._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_3 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_3 + 7));
  sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
  local_271 = false;
  if (sVar6 == sVar7) {
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108);
    local_271 = sVar6 == 0x18;
  }
  j_3._6_1_ = local_271;
  test((bool *)((long)&j_3 + 6));
  j_3._4_2_ = 0;
  while( true ) {
    uVar8 = (ulong)j_3._4_2_;
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
    if (sVar7 <= uVar8) break;
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108,(ulong)j_3._4_2_
                      );
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,
                        (ulong)j_3._4_2_);
    j_3._3_1_ = sVar6 == *pvVar5;
    test((bool *)((long)&j_3 + 3));
    j_3._4_2_ = j_3._4_2_ + 1;
  }
  local_128 = 0;
  while( true ) {
    uVar8 = local_128;
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108);
    if (sVar6 <= uVar8) break;
    piVar9 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108,local_128);
    j_4._7_1_ = *piVar9 == this->data_[local_128];
    test((bool *)((long)&j_4 + 7));
    local_128 = local_128 + 1;
  }
  k = 0;
  while( true ) {
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108,0);
    if (sVar6 <= k) break;
    local_140 = 0;
    while( true ) {
      sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108,1);
      if (sVar6 <= local_140) break;
      piVar9 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                         ((View<int,true,std::allocator<unsigned_long>> *)local_108,k,local_140);
      iVar2 = *piVar9;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0,0);
      shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ =
           iVar2 == this->data_[k + local_140 * *pvVar5];
      test((bool *)((long)&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_140 = local_140 + 1;
    }
    k = k + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_108);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c0);
  puVar1 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,0);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,1);
  *pvVar5 = 4;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,2);
  *pvVar5 = 3;
  local_1b0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  iStack_1b8 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  std::allocator<int>::allocator((allocator<int> *)((long)&j_6 + 7));
  andres::View<int,true,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_1a8,local_1b0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_1b8._M_current,this->data_,&andres::defaultOrder,&andres::defaultOrder,
             (allocator<int> *)((long)&j_6 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j_6 + 7));
  sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::dimension
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  local_301 = false;
  if (sVar6 == sVar7) {
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
    local_301 = sVar6 == 0x18;
  }
  j_6._6_1_ = local_301;
  test((bool *)((long)&j_6 + 6));
  j_6._4_2_ = 0;
  while( true ) {
    uVar8 = (ulong)j_6._4_2_;
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
    if (sVar7 <= uVar8) break;
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,(ulong)j_6._4_2_
                      );
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,
                        (ulong)j_6._4_2_);
    j_6._3_1_ = sVar6 == *pvVar5;
    test((bool *)((long)&j_6 + 3));
    j_6._4_2_ = j_6._4_2_ + 1;
  }
  local_1c8 = 0;
  while( true ) {
    uVar8 = local_1c8;
    sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::size
                      ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
    if (sVar6 <= uVar8) break;
    piVar9 = andres::View<int,_true,_std::allocator<unsigned_long>_>::operator()
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,local_1c8);
    j_7._7_1_ = *piVar9 == this->data_[local_1c8];
    test((bool *)((long)&j_7 + 7));
    local_1c8 = local_1c8 + 1;
  }
  k_1 = 0;
  while( true ) {
    sVar6 = k_1;
    sVar10 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                       ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,0);
    if (sVar10 <= sVar6) break;
    p = 0;
    while( true ) {
      sVar6 = p;
      sVar10 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                         ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,1);
      if (sVar10 <= sVar6) break;
      local_1e8 = 0;
      while( true ) {
        uVar8 = local_1e8;
        sVar6 = andres::View<int,_true,_std::allocator<unsigned_long>_>::shape
                          ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8,2);
        if (sVar6 <= uVar8) break;
        piVar9 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                           ((View<int,true,std::allocator<unsigned_long>> *)local_1a8,k_1,p,
                            local_1e8);
        sVar10 = k_1;
        sVar6 = p;
        iVar2 = *piVar9;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,0);
        uVar8 = local_1e8;
        vVar3 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,0);
        vVar4 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160,1);
        local_1e9 = iVar2 == this->data_[sVar10 + sVar6 * vVar3 + uVar8 * vVar4 * *pvVar5];
        test(&local_1e9);
        local_1e8 = local_1e8 + 1;
      }
      p = p + 1;
    }
    k_1 = k_1 + 1;
  }
  andres::View<int,_true,_std::allocator<unsigned_long>_>::~View
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_1a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_160);
  return;
}

Assistant:

void ViewTest::shapeConstructorTest() {
    // 1D
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
    }
    // 2D
    {
        std::vector<std::size_t> shape(2);
        shape[0] = 6;
        shape[1] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
        for(std::size_t j=0; j<v.shape(0); ++j) {
            for(std::size_t k=0; k<v.shape(1); ++k) {
                test(v(j, k) == data_[j+k*shape[0]]);
            }
        }
    }
    // 3D
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 2;
        shape[1] = 4;
        shape[2] = 3;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        
        test(v.dimension() == shape.size() &&
               v.size() == 24
        );
        for(unsigned short j=0; j<shape.size(); ++j) {
            test(v.shape(j) == shape[j]);
        }
        for(std::size_t j=0; j<v.size(); ++j) {
            test(v(j) == data_[j]);
        }
        for(std::size_t j=0; j<v.shape(0); ++j) {
            for(std::size_t k=0; k<v.shape(1); ++k) {
                for(std::size_t p=0; p<v.shape(2); ++p) {
                    test(v(j, k, p) == data_[ j + k*shape[0] + p*shape[0]*shape[1] ]);
                }
            }
        }
    }
}